

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnElemSegmentElemExpr_RefNull
          (BinaryReaderInterp *this,Index segment_index)

{
  bool bVar1;
  value_type local_30;
  reference local_28;
  ElemDesc *elem;
  BinaryReaderInterp *pBStack_18;
  Index segment_index_local;
  BinaryReaderInterp *this_local;
  
  elem._4_4_ = segment_index;
  pBStack_18 = this;
  elem._0_4_ = SharedValidator::OnElemSegmentElemExpr_RefNull
                         (&this->validator_,
                          (Location *)(anonymous_namespace)::BinaryReaderInterp::loc);
  bVar1 = Failed(elem._0_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_28 = std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::back
                         (&this->module_->elems);
    local_30.kind = RefNull;
    local_30.index = 0;
    std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::push_back
              (&local_28->elements,&local_30);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnElemSegmentElemExpr_RefNull(Index segment_index) {
  CHECK_RESULT(validator_.OnElemSegmentElemExpr_RefNull(loc));
  ElemDesc& elem = module_.elems.back();
  elem.elements.push_back(ElemExpr{ElemKind::RefNull, 0});
  return Result::Ok;
}